

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::AddExtension
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,
          FieldDescriptorProto *field,FileDescriptorProto *value)

{
  string *psVar1;
  bool bVar2;
  LogMessage *pLVar3;
  bool bVar4;
  char *local_88;
  char *local_80;
  char local_78;
  undefined7 uStack_77;
  undefined8 uStack_70;
  FileDescriptorProto *local_68;
  undefined1 local_60 [17];
  undefined7 uStack_4f;
  undefined8 uStack_48;
  int32 local_40;
  
  psVar1 = (field->extendee_).ptr_;
  bVar4 = true;
  if ((psVar1->_M_string_length != 0) && (*(psVar1->_M_dataplus)._M_p == '.')) {
    local_68 = value;
    std::__cxx11::string::substr((ulong)&local_88,(ulong)psVar1);
    local_40 = field->number_;
    if (local_88 == &local_78) {
      uStack_48 = uStack_70;
      local_60._0_8_ = local_60 + 0x10;
    }
    else {
      local_60._0_8_ = local_88;
    }
    uStack_4f = uStack_77;
    local_60[0x10] = local_78;
    local_60._8_8_ = local_80;
    local_80 = (char *)0x0;
    local_78 = '\0';
    local_88 = &local_78;
    bVar2 = InsertIfNotPresent<std::map<std::pair<std::__cxx11::string,int>,google::protobuf::FileDescriptorProto_const*,std::less<std::pair<std::__cxx11::string,int>>,std::allocator<std::pair<std::pair<std::__cxx11::string,int>const,google::protobuf::FileDescriptorProto_const*>>>>
                      (&this->by_extension_,(first_type *)local_60,&local_68);
    if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
      operator_delete((void *)local_60._0_8_,stack0xffffffffffffffb0 + 1);
    }
    if (local_88 != &local_78) {
      operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
    }
    if (!bVar2) {
      internal::LogMessage::LogMessage
                ((LogMessage *)local_60,LOGLEVEL_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
                 ,0xa2);
      pLVar3 = internal::LogMessage::operator<<
                         ((LogMessage *)local_60,
                          "Extension conflicts with extension already in database: extend ");
      pLVar3 = internal::LogMessage::operator<<(pLVar3,(field->extendee_).ptr_);
      pLVar3 = internal::LogMessage::operator<<(pLVar3," { ");
      pLVar3 = internal::LogMessage::operator<<(pLVar3,(field->name_).ptr_);
      pLVar3 = internal::LogMessage::operator<<(pLVar3," = ");
      pLVar3 = internal::LogMessage::operator<<(pLVar3,field->number_);
      pLVar3 = internal::LogMessage::operator<<(pLVar3," }");
      internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar3);
      internal::LogMessage::~LogMessage((LogMessage *)local_60);
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddExtension(
    const FieldDescriptorProto& field,
    Value value) {
  if (!field.extendee().empty() && field.extendee()[0] == '.') {
    // The extension is fully-qualified.  We can use it as a lookup key in
    // the by_symbol_ table.
    if (!InsertIfNotPresent(
            &by_extension_,
            std::make_pair(field.extendee().substr(1), field.number()),
            value)) {
      GOOGLE_LOG(ERROR) << "Extension conflicts with extension already in database: "
                    "extend " << field.extendee() << " { "
                 << field.name() << " = " << field.number() << " }";
      return false;
    }
  } else {
    // Not fully-qualified.  We can't really do anything here, unfortunately.
    // We don't consider this an error, though, because the descriptor is
    // valid.
  }
  return true;
}